

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

ReadFileResult __thiscall
cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit(ConfigurePreset *this,int version)

{
  __optional_eq_t<bool,_bool> _Var1;
  ulong uVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  *this_00;
  size_type sVar3;
  __optional_eq_t<bool,_bool> local_66;
  __optional_eq_t<bool,_bool> local_65;
  allocator<char> local_51;
  key_type local_50;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  ConfigurePreset *local_28;
  ConfigurePreset *preset;
  ConfigurePreset *pCStack_18;
  int version_local;
  ConfigurePreset *this_local;
  
  if (((this->super_Preset).Hidden & 1U) == 0) {
    local_28 = this;
    preset._4_4_ = version;
    pCStack_18 = this;
    if (version < 3) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        return INVALID_PRESET;
      }
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        return INVALID_PRESET;
      }
    }
    local_29 = false;
    _Var1 = std::operator==(&local_28->WarnDev,&local_29);
    local_65 = false;
    if (_Var1) {
      local_2a = true;
      local_65 = std::operator==(&local_28->ErrorDev,&local_2a);
    }
    if (local_65 != false) {
      return INVALID_PRESET;
    }
    local_2b = false;
    _Var1 = std::operator==(&local_28->WarnDeprecated,&local_2b);
    local_66 = false;
    if (_Var1) {
      local_2c = true;
      local_66 = std::operator==(&local_28->ErrorDeprecated,&local_2c);
    }
    if (local_66 != false) {
      return INVALID_PRESET;
    }
    this_00 = &local_28->CacheVariables;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
            ::count(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if (sVar3 != 0) {
      return INVALID_PRESET;
    }
  }
  return READ_OK;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult
cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit(int version)
{
  auto& preset = *this;
  if (!preset.Hidden) {
    if (version < 3) {
      if (preset.Generator.empty()) {
        return ReadFileResult::INVALID_PRESET;
      }
      if (preset.BinaryDir.empty()) {
        return ReadFileResult::INVALID_PRESET;
      }
    }

    if (preset.WarnDev == false && preset.ErrorDev == true) {
      return ReadFileResult::INVALID_PRESET;
    }
    if (preset.WarnDeprecated == false && preset.ErrorDeprecated == true) {
      return ReadFileResult::INVALID_PRESET;
    }
    if (preset.CacheVariables.count("") != 0) {
      return ReadFileResult::INVALID_PRESET;
    }
  }

  return ReadFileResult::READ_OK;
}